

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void lzham::vector<lzham::lzcompressor::lzpriced_decision>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  int iVar1;
  lzpriced_decision *pDst;
  lzpriced_decision *pSrc_end;
  lzpriced_decision *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  pDst = (lzpriced_decision *)pDst_void;
  for (pSrc = (lzpriced_decision *)pSrc_void;
      pSrc != (lzpriced_decision *)((long)pSrc_void + (ulong)num * 0x18); pSrc = pSrc + 1) {
    iVar1 = (pSrc->super_lzdecision).m_len;
    (pDst->super_lzdecision).m_pos = (pSrc->super_lzdecision).m_pos;
    (pDst->super_lzdecision).m_len = iVar1;
    *(undefined8 *)&(pDst->super_lzdecision).m_dist =
         *(undefined8 *)&(pSrc->super_lzdecision).m_dist;
    pDst->m_cost = pSrc->m_cost;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }